

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O3

void __thiscall tf::Runtime::corun(Runtime *this)

{
  atomic<int> *paVar1;
  Node *pNVar2;
  undefined8 uVar3;
  exception_ptr e;
  anon_class_8_1_8991fb9c local_20;
  Runtime *local_18;
  
  pNVar2 = this->_parent;
  LOCK();
  paVar1 = &pNVar2->_estate;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i | 0x40000000;
  UNLOCK();
  local_20.this = this;
  Executor::_corun_until<tf::Runtime::corun()::_lambda()_1_>
            (this->_executor,this->_worker,&local_20);
  LOCK();
  paVar1 = &pNVar2->_estate;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i & 0xbfffffff;
  UNLOCK();
  pNVar2 = this->_parent;
  local_18 = (Runtime *)(pNVar2->_exception_ptr)._M_exception_object;
  if (local_18 == (Runtime *)0x0) {
    return;
  }
  std::__exception_ptr::exception_ptr::_M_addref();
  local_20.this = (Runtime *)(pNVar2->_exception_ptr)._M_exception_object;
  (pNVar2->_exception_ptr)._M_exception_object = (void *)0x0;
  if (local_20.this != (Runtime *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  local_20.this = local_18;
  if (local_18 != (Runtime *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar3 = std::rethrow_exception((exception_ptr)&local_20);
  if (local_20.this != (Runtime *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  if (local_18 != (Runtime *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  _Unwind_Resume(uVar3);
}

Assistant:

inline void Runtime::corun() {
  {
    AnchorGuard anchor(_parent);
    _executor._corun_until(_worker, [this] () -> bool {
      return _parent->_join_counter.load(std::memory_order_acquire) == 0;
    });
  }
  _parent->_rethrow_exception();
}